

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O2

void P_ResumeConversation(void)

{
  AActor *pAVar1;
  AActor *pc;
  AActor **obj;
  int i;
  long lVar2;
  
  obj = (AActor **)&DAT_017dc200;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    if (playeringame[lVar2] == true) {
      pAVar1 = GC::ReadBarrier<AActor>(obj + 1);
      if (pAVar1 != (AActor *)0x0) {
        pAVar1 = GC::ReadBarrier<AActor>(obj);
        if (pAVar1 != (AActor *)0x0) {
          pAVar1 = GC::ReadBarrier<AActor>(obj);
          pc = GC::ReadBarrier<AActor>(obj + 1);
          P_StartConversation(pAVar1,pc,*(bool *)(obj + 3),false);
        }
      }
    }
    obj = obj + 0x54;
  }
  return;
}

Assistant:

void P_ResumeConversation ()
{
	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (!playeringame[i])
			continue;

		player_t *p = &players[i];

		if (p->ConversationPC != NULL && p->ConversationNPC != NULL)
		{
			P_StartConversation (p->ConversationNPC, p->ConversationPC, p->ConversationFaceTalker, false);
		}
	}
}